

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::shader_source(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  GLuint shader_00;
  allocator<char> local_99;
  GLuint program;
  GLuint local_78;
  allocator<char> local_71;
  GLuint shader;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  GLuint notAShader;
  NegativeTestContext *ctx_local;
  
  pNStack_10 = ctx;
  local_14 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  glu::CallLogWrapper::glDeleteShader(&pNStack_10->super_CallLogWrapper,local_14);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.",&local_39
            );
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glShaderSource
            (&pNStack_10->super_CallLogWrapper,local_14,0,(GLchar **)0x0,(GLint *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shader,"GL_INVALID_VALUE is generated if count is less than 0.",&local_71);
  NegativeTestContext::beginSection(pNVar1,(string *)&shader);
  std::__cxx11::string::~string((string *)&shader);
  std::allocator<char>::~allocator(&local_71);
  local_78 = glu::CallLogWrapper::glCreateShader(&pNStack_10->super_CallLogWrapper,0x8b31);
  glu::CallLogWrapper::glShaderSource
            (&pNStack_10->super_CallLogWrapper,local_78,-1,(GLchar **)0x0,(GLint *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,
             "GL_INVALID_OPERATION is generated if shader is not a shader object.",&local_99);
  NegativeTestContext::beginSection(pNVar1,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  std::allocator<char>::~allocator(&local_99);
  shader_00 = glu::CallLogWrapper::glCreateProgram(&pNStack_10->super_CallLogWrapper);
  glu::CallLogWrapper::glShaderSource
            (&pNStack_10->super_CallLogWrapper,shader_00,0,(GLchar **)0x0,(GLint *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x502);
  NegativeTestContext::endSection(pNStack_10);
  glu::CallLogWrapper::glDeleteProgram(&pNStack_10->super_CallLogWrapper,shader_00);
  glu::CallLogWrapper::glDeleteShader(&pNStack_10->super_CallLogWrapper,local_78);
  return;
}

Assistant:

void shader_source (NegativeTestContext& ctx)
{
	// make notAShader not a shader id
	const GLuint notAShader = ctx.glCreateShader(GL_VERTEX_SHADER);
	ctx.glDeleteShader(notAShader);

	ctx.beginSection("GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.");
	ctx.glShaderSource(notAShader, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count is less than 0.");
	GLuint shader = ctx.glCreateShader(GL_VERTEX_SHADER);
	ctx.glShaderSource(shader, -1, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is not a shader object.");
	GLuint program = ctx.glCreateProgram();
	ctx.glShaderSource(program, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteProgram(program);
	ctx.glDeleteShader(shader);
}